

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::repeated(QByteArray *this,qsizetype times)

{
  bool bVar1;
  qsizetype qVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  char *pcVar5;
  char *__src;
  size_t __n;
  long in_RDX;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qsizetype halfResultSize;
  char *end;
  qsizetype sizeSoFar;
  qsizetype resultSize;
  QByteArray result;
  QByteArray *in_stack_ffffffffffffff38;
  QByteArray *in_stack_ffffffffffffff40;
  QByteArray *in_stack_ffffffffffffff50;
  QByteArray *local_68;
  size_t local_60;
  QArrayDataPointer<char> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty((QByteArray *)0x4b5eb3);
  if (bVar1) {
    QByteArray(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else if (in_RDX < 2) {
    if (in_RDX == 1) {
      QByteArray(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      QByteArray((QByteArray *)0x4b5f01);
    }
  }
  else {
    qVar2 = size(in_RSI);
    puVar3 = (undefined1 *)(in_RDX * qVar2);
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray((QByteArray *)0x4b5f64);
    reserve(in_stack_ffffffffffffff50,in_RDX);
    puVar4 = (undefined1 *)capacity((QByteArray *)0x4b5f85);
    if (puVar4 == puVar3) {
      pcVar5 = QArrayDataPointer<char>::data(&local_28);
      __src = data(in_stack_ffffffffffffff40);
      __n = size(in_RSI);
      memcpy(pcVar5,__src,__n);
      local_60 = size(in_RSI);
      pcVar5 = QArrayDataPointer<char>::data(&local_28);
      local_68 = (QByteArray *)(pcVar5 + local_60);
      for (; (long)local_60 <= (long)puVar3 >> 1; local_60 = local_60 << 1) {
        pcVar5 = QArrayDataPointer<char>::data(&local_28);
        memcpy(local_68,pcVar5,local_60);
        local_68 = (QByteArray *)((long)&(local_68->d).d + local_60);
      }
      pcVar5 = QArrayDataPointer<char>::data(&local_28);
      memcpy(local_68,pcVar5,(long)puVar3 - local_60);
      pcVar5 = QArrayDataPointer<char>::data(&local_28);
      pcVar5[(long)puVar3] = '\0';
      local_28.size = (qsizetype)puVar3;
      QByteArray(local_68,in_stack_ffffffffffffff38);
    }
    else {
      QByteArray((QByteArray *)0x4b5fa5);
    }
    ~QByteArray((QByteArray *)0x4b611d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QByteArray::repeated(qsizetype times) const
{
    if (isEmpty())
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QByteArray();
    }

    const qsizetype resultSize = times * size();

    QByteArray result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QByteArray(); // not enough memory

    memcpy(result.d.data(), data(), size());

    qsizetype sizeSoFar = size();
    char *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar);
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), resultSize - sizeSoFar);
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}